

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O2

VRMatrix4 * MinVR::operator*(VRMatrix4 *__return_storage_ptr__,VRMatrix4 *m,float *s)

{
  float fVar1;
  float *pfVar2;
  int r;
  long lVar3;
  long lVar4;
  float *pfVar5;
  
  VRMatrix4::VRMatrix4(__return_storage_ptr__);
  pfVar5 = m->m;
  fVar1 = *s;
  pfVar2 = __return_storage_ptr__->m;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 0x10) {
      *(float *)((long)pfVar2 + lVar4) = *(float *)((long)pfVar5 + lVar4) * fVar1;
    }
    pfVar2 = pfVar2 + 1;
    pfVar5 = pfVar5 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

VRMatrix4 operator*(const VRMatrix4& m, const float& s) {
  VRMatrix4 result;
  for (int r = 0; r < 4; r++) {
    for (int c = 0; c < 4; c++) {
      result(r,c) = m(r,c) * s;
    }
  }
  return result;
}